

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall FirstTag::FirstTag(FirstTag *this)

{
  child_tags_list_t *pcVar1;
  long *local_38;
  long local_30;
  long local_28 [2];
  
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"firstTag","");
  (this->super_tag_t<cfgfile::string_trait_t>)._vptr_tag_t = (_func_int **)&PTR__tag_t_001644c0;
  (this->super_tag_t<cfgfile::string_trait_t>).m_name._M_dataplus._M_p =
       (pointer)&(this->super_tag_t<cfgfile::string_trait_t>).m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_tag_t<cfgfile::string_trait_t>).m_name,local_38,
             local_30 + (long)local_38);
  (this->super_tag_t<cfgfile::string_trait_t>).m_is_mandatory = false;
  (this->super_tag_t<cfgfile::string_trait_t>).m_is_defined = false;
  pcVar1 = &(this->super_tag_t<cfgfile::string_trait_t>).m_child_tags;
  (pcVar1->
  super__Vector_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pcVar1->
  super__Vector_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->super_tag_t<cfgfile::string_trait_t>).m_child_tags.
    super__Vector_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  *(undefined4 *)&(this->super_tag_t<cfgfile::string_trait_t>).m_line_number = 0xffffffff;
  *(undefined4 *)((long)&(this->super_tag_t<cfgfile::string_trait_t>).m_line_number + 4) =
       0xffffffff;
  *(undefined4 *)&(this->super_tag_t<cfgfile::string_trait_t>).m_column_number = 0xffffffff;
  *(undefined4 *)((long)&(this->super_tag_t<cfgfile::string_trait_t>).m_column_number + 4) =
       0xffffffff;
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  (this->super_tag_t<cfgfile::string_trait_t>)._vptr_tag_t = (_func_int **)&PTR__FirstTag_00164450;
  this->m_started = false;
  this->m_finished = false;
  this->m_withString = false;
  SecondTag::SecondTag(&this->m_child,&this->super_tag_t<cfgfile::string_trait_t>);
  return;
}

Assistant:

FirstTag()
		:	cfgfile::tag_t<>( "firstTag", false )
		,	m_started( false )
		,	m_finished( false )
		,	m_withString( false )
		,	m_child( *this )
	{
	}